

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void print_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,int newln_p)

{
  char *local_b0;
  char *local_a8;
  mem_attr_t local_90;
  ulong local_70;
  size_t i;
  MIR_op_t op;
  int flag;
  MIR_context_t ctx;
  int newln_p_local;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  MIR_output_insn(gen_ctx->ctx,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
  for (local_70 = 0; local_70 < *(ulong *)&insn->field_0x18 >> 0x20; local_70 = local_70 + 1) {
    memcpy(&i,insn->ops + local_70,0x30);
    if ((((ushort)op.data & 0xff) == 0xb) && (op.u.mem.alias != 0)) {
      VARR_mem_attr_tget(&local_90,gen_ctx->mem_attrs,(ulong)op.u.mem.alias);
      if (local_90.alloca_flag == 0) {
        local_a8 = "";
      }
      else {
        if ((local_90.alloca_flag & 3) == 0) {
          local_b0 = "u";
          if ((local_90.alloca_flag & 1) != 0) {
            local_b0 = "a";
          }
        }
        else {
          local_b0 = "au";
        }
        local_a8 = local_b0;
      }
      fprintf((FILE *)gen_ctx->debug_file," # m%lu%s",(ulong)op.u.mem.alias,local_a8);
    }
  }
  if (newln_p != 0) {
    fprintf((FILE *)gen_ctx->debug_file,"\n");
  }
  return;
}

Assistant:

static void print_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, int newln_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  int flag;
  MIR_op_t op;

  MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, FALSE);
  for (size_t i = 0; i < insn->nops; i++) {
    op = insn->ops[i];
    if (op.mode == MIR_OP_VAR_MEM && op.u.var_mem.nloc != 0) {
      flag = VARR_GET (mem_attr_t, mem_attrs, op.u.var_mem.nloc).alloca_flag;
      fprintf (debug_file, " # m%lu%s", (unsigned long) op.u.var_mem.nloc,
               !flag                               ? ""
               : flag & (MAY_ALLOCA | MUST_ALLOCA) ? "au"
               : flag & MAY_ALLOCA                 ? "a"
                                                   : "u");
    }
  }
  if (newln_p) fprintf (debug_file, "\n");
}